

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

int * __thiscall embree::Stream<int>::unget(Stream<int> *this,size_t n)

{
  int *piVar1;
  runtime_error *this_00;
  
  if (n <= this->past) {
    this->past = this->past - n;
    this->future = this->future + n;
    piVar1 = peek(this);
    return piVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"cannot unget that many items");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const T& unget(size_t n = 1) {
      if (past < n) THROW_RUNTIME_ERROR ("cannot unget that many items");
      past -= n; future += n;
      return peek();
    }